

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl.c
# Opt level: O0

void av1_set_rtc_reference_structure_one_layer(AV1_COMP *cpi,int gf_update)

{
  int iVar1;
  uint uVar2;
  int in_ESI;
  long *in_RDI;
  int sh;
  int i_1;
  int i;
  int th_idx;
  uint64_t th_frame_sad [4] [3];
  int last2_idx;
  int alt_ref_idx;
  int gld_idx;
  int last_idx_refresh;
  int last_idx;
  uint lag_alt;
  uint frame_number;
  RTC_REF *rtc_ref;
  ExtRefreshFrameFlagsInfo *ext_refresh_frame_flags;
  RATE_CONTROL *rc;
  ExternalFlags *ext_flags;
  AV1_COMMON *cm;
  uint local_cc;
  int local_c4;
  int local_c0;
  ulong local_b8 [12];
  uint local_54;
  uint local_50;
  undefined4 local_4c;
  undefined4 local_48;
  uint local_44;
  uint local_40;
  uint local_3c;
  long local_38;
  undefined1 *local_30;
  long *local_28;
  uint *local_20;
  long *local_18;
  int local_c;
  long *local_8;
  
  local_18 = in_RDI + 0x77f0;
  local_20 = (uint *)(in_RDI + 0x85b0);
  local_28 = in_RDI + 0xc0ee;
  local_30 = (undefined1 *)((long)in_RDI + 0x42d84);
  local_38 = *in_RDI + 0x14d68;
  if (*(int *)((long)in_RDI + 0x423c4) == 0) {
    local_cc = *(uint *)(in_RDI + 0x77f2);
  }
  else {
    local_cc = *(uint *)(in_RDI + 0xc105);
  }
  local_3c = local_cc;
  local_40 = 4;
  local_44 = 0;
  local_48 = 0;
  local_4c = 0;
  local_50 = 0;
  local_54 = 0;
  *(undefined1 *)((long)in_RDI + 0x42d89) = 1;
  *local_20 = 0;
  *local_30 = 1;
  *(undefined1 *)((long)in_RDI + 0x42d85) = 0;
  *(undefined1 *)(in_RDI + 0x85b1) = 0;
  local_c = in_ESI;
  local_8 = in_RDI;
  if ((int)in_RDI[0xc1b7] != 0) {
    local_40 = 6;
    memcpy(local_b8,&DAT_00bbf5c0,0x60);
    iVar1 = (int)local_8[0xc1b7] + -1;
    if (local_b8[(long)iVar1 * 3] < (ulong)local_28[9]) {
      local_40 = 3;
    }
    else if (local_b8[(long)iVar1 * 3 + 1] < (ulong)local_28[9]) {
      local_40 = 4;
    }
    else if (local_b8[(long)iVar1 * 3 + 2] < (ulong)local_28[9]) {
      local_40 = 5;
    }
  }
  for (local_c0 = 0; local_c0 < 7; local_c0 = local_c0 + 1) {
    *(undefined4 *)(local_38 + 0x1c + (long)local_c0 * 4) = 7;
  }
  for (local_c4 = 0; local_c4 < 8; local_c4 = local_c4 + 1) {
    *(undefined4 *)(local_38 + 0x38 + (long)local_c4 * 4) = 0;
  }
  *local_20 = *local_20 ^ 1;
  if ((int)local_8[0xc1ab] == 0) {
    *local_20 = *local_20 ^ 0x40;
    *local_20 = *local_20 ^ 8;
    if ((int)local_8[0xc198] != 0) {
      *local_20 = *local_20 ^ 2;
    }
  }
  if (1 < local_3c) {
    local_44 = (local_3c - 1) % 6;
  }
  uVar2 = local_3c % 6;
  if (local_40 < local_3c) {
    local_50 = (local_3c - local_40) % 6;
  }
  if (((int)local_8[0xc198] != 0) && (2 < local_3c)) {
    local_54 = (local_3c - 2) % 6;
  }
  *(uint *)(local_38 + 0x1c) = local_44;
  *(uint *)(local_38 + 0x20) = uVar2;
  if ((int)local_8[0xc198] != 0) {
    *(uint *)(local_38 + 0x20) = local_54;
    *(uint *)(local_38 + 0x24) = uVar2;
  }
  *(undefined4 *)(local_38 + 0x28) = 6;
  *(uint *)(local_38 + 0x34) = local_50;
  *(undefined4 *)(local_38 + 0x38 + (long)(int)uVar2 * 4) = 1;
  if ((local_c != 0) && ((char)*local_18 != '\0')) {
    local_30[1] = 1;
    *(undefined4 *)(local_38 + 0x50) = 1;
  }
  *(undefined4 *)(local_38 + 0x6c) = 6;
  *(undefined4 *)((long)local_8 + 0x42d7c) = 1;
  *(uint *)((long)local_8 + 0x42d7c) =
       (uint)(*(int *)(local_38 + 0x1c) < 7) & *(uint *)((long)local_8 + 0x42d7c);
  *(uint *)((long)local_8 + 0x42d7c) =
       (uint)(*(int *)(local_38 + 0x20) < 7) & *(uint *)((long)local_8 + 0x42d7c);
  *(uint *)((long)local_8 + 0x42d7c) =
       (uint)(*(int *)(local_38 + 0x28) < 7) & *(uint *)((long)local_8 + 0x42d7c);
  *(uint *)((long)local_8 + 0x42d7c) =
       (uint)(*(int *)(local_38 + 0x34) < 7) & *(uint *)((long)local_8 + 0x42d7c);
  if ((int)local_8[0xc198] != 0) {
    *(uint *)((long)local_8 + 0x42d7c) =
         (uint)(*(int *)(local_38 + 0x24) < 7) & *(uint *)((long)local_8 + 0x42d7c);
  }
  return;
}

Assistant:

void av1_set_rtc_reference_structure_one_layer(AV1_COMP *cpi, int gf_update) {
  AV1_COMMON *const cm = &cpi->common;
  ExternalFlags *const ext_flags = &cpi->ext_flags;
  RATE_CONTROL *const rc = &cpi->rc;
  ExtRefreshFrameFlagsInfo *const ext_refresh_frame_flags =
      &ext_flags->refresh_frame;
  RTC_REF *const rtc_ref = &cpi->ppi->rtc_ref;
  unsigned int frame_number = (cpi->oxcf.rc_cfg.drop_frames_water_mark)
                                  ? rc->frame_number_encoded
                                  : cm->current_frame.frame_number;
  unsigned int lag_alt = 4;
  int last_idx = 0;
  int last_idx_refresh = 0;
  int gld_idx = 0;
  int alt_ref_idx = 0;
  int last2_idx = 0;
  ext_refresh_frame_flags->update_pending = 1;
  ext_flags->ref_frame_flags = 0;
  ext_refresh_frame_flags->last_frame = 1;
  ext_refresh_frame_flags->golden_frame = 0;
  ext_refresh_frame_flags->alt_ref_frame = 0;
  // Decide altref lag adaptively for rt
  if (cpi->sf.rt_sf.sad_based_adp_altref_lag) {
    lag_alt = 6;
    const uint64_t th_frame_sad[4][3] = {
      { 18000, 18000, 18000 },  // HDRES CPU 9
      { 25000, 25000, 25000 },  // MIDRES CPU 9
      { 40000, 30000, 20000 },  // HDRES CPU 10
      { 30000, 25000, 20000 }   // MIDRES CPU 10
    };
    int th_idx = cpi->sf.rt_sf.sad_based_adp_altref_lag - 1;
    assert(th_idx < 4);
    if (rc->avg_source_sad > th_frame_sad[th_idx][0])
      lag_alt = 3;
    else if (rc->avg_source_sad > th_frame_sad[th_idx][1])
      lag_alt = 4;
    else if (rc->avg_source_sad > th_frame_sad[th_idx][2])
      lag_alt = 5;
  }
  // This defines the reference structure for 1 layer (non-svc) RTC encoding.
  // To avoid the internal/default reference structure for non-realtime
  // overwriting this behavior, we use the "svc" ref parameters from the
  // external control SET_SVC_REF_FRAME_CONFIG.
  // TODO(marpan): rename that control and the related internal parameters
  // to rtc_ref.
  for (int i = 0; i < INTER_REFS_PER_FRAME; ++i) rtc_ref->ref_idx[i] = 7;
  for (int i = 0; i < REF_FRAMES; ++i) rtc_ref->refresh[i] = 0;
  // Set the reference frame flags.
  ext_flags->ref_frame_flags ^= AOM_LAST_FLAG;
  if (!cpi->sf.rt_sf.force_only_last_ref) {
    ext_flags->ref_frame_flags ^= AOM_ALT_FLAG;
    ext_flags->ref_frame_flags ^= AOM_GOLD_FLAG;
    if (cpi->sf.rt_sf.ref_frame_comp_nonrd[1])
      ext_flags->ref_frame_flags ^= AOM_LAST2_FLAG;
  }
  const int sh = 6;
  // Moving index slot for last: 0 - (sh - 1).
  if (frame_number > 1) last_idx = ((frame_number - 1) % sh);
  // Moving index for refresh of last: one ahead for next frame.
  last_idx_refresh = (frame_number % sh);
  gld_idx = 6;

  // Moving index for alt_ref, lag behind LAST by lag_alt frames.
  if (frame_number > lag_alt) alt_ref_idx = ((frame_number - lag_alt) % sh);
  if (cpi->sf.rt_sf.ref_frame_comp_nonrd[1]) {
    // Moving index for LAST2, lag behind LAST by 2 frames.
    if (frame_number > 2) last2_idx = ((frame_number - 2) % sh);
  }
  rtc_ref->ref_idx[0] = last_idx;          // LAST
  rtc_ref->ref_idx[1] = last_idx_refresh;  // LAST2 (for refresh of last).
  if (cpi->sf.rt_sf.ref_frame_comp_nonrd[1]) {
    rtc_ref->ref_idx[1] = last2_idx;         // LAST2
    rtc_ref->ref_idx[2] = last_idx_refresh;  // LAST3 (for refresh of last).
  }
  rtc_ref->ref_idx[3] = gld_idx;      // GOLDEN
  rtc_ref->ref_idx[6] = alt_ref_idx;  // ALT_REF
  // Refresh this slot, which will become LAST on next frame.
  rtc_ref->refresh[last_idx_refresh] = 1;
  // Update GOLDEN on period for fixed slot case.
  if (gf_update && cm->current_frame.frame_type != KEY_FRAME) {
    ext_refresh_frame_flags->golden_frame = 1;
    rtc_ref->refresh[gld_idx] = 1;
  }
  rtc_ref->gld_idx_1layer = gld_idx;
  // Set the flag to reduce the number of reference frame buffers used.
  // This assumes that slot 7 is never used.
  cpi->rt_reduce_num_ref_buffers = 1;
  cpi->rt_reduce_num_ref_buffers &= (rtc_ref->ref_idx[0] < 7);
  cpi->rt_reduce_num_ref_buffers &= (rtc_ref->ref_idx[1] < 7);
  cpi->rt_reduce_num_ref_buffers &= (rtc_ref->ref_idx[3] < 7);
  cpi->rt_reduce_num_ref_buffers &= (rtc_ref->ref_idx[6] < 7);
  if (cpi->sf.rt_sf.ref_frame_comp_nonrd[1])
    cpi->rt_reduce_num_ref_buffers &= (rtc_ref->ref_idx[2] < 7);
}